

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O2

void P_AlignPlane(sector_t_conflict *sec,line_t_conflict *line,int which)

{
  double *pdVar1;
  vertex_t *pvVar2;
  vertex_t *pvVar3;
  long lVar4;
  sector_t_conflict *psVar5;
  line_t_conflict **pplVar6;
  uint uVar7;
  line_t_conflict *plVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  TVector3<double> local_58;
  TVector3<double> local_38;
  
  if (line->backsector != (sector_t_conflict *)0x0) {
    pplVar6 = sec->lines;
    pvVar3 = (*pplVar6)->v1;
    dVar10 = 0.0;
    for (uVar7 = sec->linecount * 2; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
      if ((uVar7 & 1) == 0) {
        plVar8 = *pplVar6;
      }
      else {
        plVar8 = *pplVar6;
        pplVar6 = pplVar6 + 1;
        plVar8 = (line_t_conflict *)&plVar8->v2;
      }
      pvVar2 = plVar8->v1;
      dVar11 = ABS((line->delta).X * ((line->v1->p).Y - (pvVar2->p).Y) -
                   (line->delta).Y * ((line->v1->p).X - (pvVar2->p).X));
      if (dVar11 <= dVar10) {
        dVar11 = dVar10;
        pvVar2 = pvVar3;
      }
      pvVar3 = pvVar2;
      dVar10 = dVar11;
    }
    psVar5 = line->backsector;
    if (line->frontsector != sec) {
      psVar5 = line->frontsector;
    }
    lVar4 = 0xa8;
    if (which == 0) {
      lVar4 = 0x50;
    }
    dVar10 = *(double *)((long)&psVar5->planes[0].xform.xOffs + lVar4);
    dVar11 = (line->delta).X;
    dVar9 = (pvVar3->p).Y - (line->v1->p).Y;
    dVar12 = *(double *)((long)&sec->planes[0].xform.xOffs + lVar4) - dVar10;
    dVar13 = (pvVar3->p).X - (line->v1->p).X;
    local_58.Z = dVar11 * dVar9 - dVar13 * (line->delta).Y;
    local_58.X = (line->delta).Y * dVar12 - dVar9 * 0.0;
    local_58.Y = dVar13 * 0.0 - dVar11 * dVar12;
    TVector3<double>::Unit(&local_38,&local_58);
    lVar4 = 0xd8;
    if (((which == 0) && (lVar4 = 0xb0, local_38.Z < 0.0)) || ((which == 1 && (0.0 < local_38.Z))))
    {
      local_38.X = -local_38.X;
      local_38.Y = -local_38.Y;
      local_38.Z = -local_38.Z;
    }
    dVar11 = (line->v1->p).X;
    dVar9 = (line->v1->p).Y;
    pdVar1 = (double *)((long)&sec->planes[0].xform.xOffs + lVar4);
    *pdVar1 = local_38.X;
    pdVar1[1] = local_38.Y;
    *(double *)((long)&sec->planes[0].xform.baseyOffs + lVar4) = local_38.Z;
    *(double *)((long)&sec->planes[0].xform.xScale + lVar4) =
         (-local_38.X * dVar11 - local_38.Y * dVar9) - dVar10 * local_38.Z;
    *(double *)((long)&sec->planes[0].xform.yScale + lVar4) = -1.0 / local_38.Z;
  }
  return;
}

Assistant:

static void P_AlignPlane(sector_t *sec, line_t *line, int which)
{
	sector_t *refsec;
	double bestdist;
	vertex_t *refvert = (*sec->lines)->v1;	// Shut up, GCC
	int i;
	line_t **probe;

	if (line->backsector == NULL)
		return;

	// Find furthest vertex from the reference line. It, along with the two ends
	// of the line, will define the plane.
	bestdist = 0;
	for (i = sec->linecount * 2, probe = sec->lines; i > 0; i--)
	{
		double dist;
		vertex_t *vert;

		if (i & 1)
			vert = (*probe++)->v2;
		else
			vert = (*probe)->v1;
		dist = fabs((line->v1->fY() - vert->fY()) * line->Delta().X -
			(line->v1->fX() - vert->fX()) * line->Delta().Y);

		if (dist > bestdist)
		{
			bestdist = dist;
			refvert = vert;
		}
	}

	refsec = line->frontsector == sec ? line->backsector : line->frontsector;

	DVector3 p, v1, v2, cross;

	secplane_t *srcplane;
	double srcheight, destheight;

	srcplane = (which == 0) ? &sec->floorplane : &sec->ceilingplane;
	srcheight = (which == 0) ? sec->GetPlaneTexZ(sector_t::floor) : sec->GetPlaneTexZ(sector_t::ceiling);
	destheight = (which == 0) ? refsec->GetPlaneTexZ(sector_t::floor) : refsec->GetPlaneTexZ(sector_t::ceiling);

	p[0] = line->v1->fX();
	p[1] = line->v1->fY();
	p[2] = destheight;
	v1[0] = line->Delta().X;
	v1[1] = line->Delta().Y;
	v1[2] = 0;
	v2[0] = refvert->fX() - line->v1->fX();
	v2[1] = refvert->fY() - line->v1->fY();
	v2[2] = srcheight - destheight;

	cross = (v1 ^ v2).Unit();

	// Fix backward normals
	if ((cross.Z < 0 && which == 0) || (cross.Z > 0 && which == 1))
	{
		cross = -cross;
	}

	double dist = -cross[0] * line->v1->fX() - cross[1] * line->v1->fY() - cross[2] * destheight;
	srcplane->set(cross[0], cross[1], cross[2], dist);
}